

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_api_v2.c
# Opt level: O3

MPP_RET hal_vp8e_init(void *hal,MppEncHalCfg *cfg)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  MppEncHalApi *pMVar3;
  void *pvVar4;
  MppClientType MVar5;
  
  *(undefined8 *)hal = 0;
  *(undefined8 *)((long)hal + 8) = 0;
  mpp_env_get_u32("vp8e_hal_debug",&vp8e_hal_debug,0);
  RVar1 = mpp_get_vcodec_type();
  if ((RVar1 >> 0x12 & 1) == 0) {
    if ((RVar1 >> 0x11 & 1) == 0) {
      _mpp_log_l(2,"hal_vp8e_api_v2","Failed to init due to unsupported hard mode, hw_flag = %d\n",
                 "hal_vp8e_init",(ulong)RVar1);
      return MPP_ERR_INIT;
    }
    MVar5 = VPU_CLIENT_VEPU1;
    pMVar3 = &hal_vp8e_vepu1;
  }
  else {
    MVar5 = VPU_CLIENT_VEPU2;
    pMVar3 = &hal_vp8e_vepu2;
  }
  pvVar4 = mpp_osal_calloc("hal_vp8e_init",(ulong)pMVar3->ctx_size);
  if (pvVar4 == (void *)0x0) {
    return MPP_ERR_MALLOC;
  }
  *(void **)((long)hal + 8) = pvVar4;
  *(MppEncHalApi **)hal = pMVar3;
  cfg->type = MVar5;
  MVar2 = (*pMVar3->init)(pvVar4,cfg);
  return MVar2;
}

Assistant:

static MPP_RET hal_vp8e_init(void *hal, MppEncHalCfg *cfg)
{
    const MppEncHalApi  *p_api = NULL;
    Halvp8eCtx *ctx = (Halvp8eCtx *)hal;
    MppClientType type = VPU_CLIENT_BUTT;
    void* hw_ctx = NULL;

    memset(ctx, 0, sizeof(Halvp8eCtx));

    mpp_env_get_u32("vp8e_hal_debug", &vp8e_hal_debug, 0);

    {
        RK_U32 hw_flag = mpp_get_vcodec_type();
        if (hw_flag & HAVE_VEPU2) {
            p_api = &hal_vp8e_vepu2;
            type = VPU_CLIENT_VEPU2;
        } else if (hw_flag & HAVE_VEPU1) {
            p_api = &hal_vp8e_vepu1;
            type = VPU_CLIENT_VEPU1;
        } else {
            mpp_err_f("Failed to init due to unsupported hard mode, hw_flag = %d\n", hw_flag);
            return MPP_ERR_INIT;
        }
    }

    mpp_assert(p_api);
    mpp_assert(type != VPU_CLIENT_BUTT);

    hw_ctx = mpp_calloc_size(void, p_api->ctx_size);
    if (NULL == hw_ctx)
        return MPP_ERR_MALLOC;

    ctx->hw_ctx = hw_ctx;
    ctx->api = p_api;
    cfg->type = type;

    return p_api->init(hw_ctx, cfg);
}